

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  word *pwVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 uVar4;
  PromiseNode *pPVar5;
  TransformPromiseNodeBase *this_00;
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar6;
  Own<kj::_::ChainPromiseNode> OVar7;
  Reader params;
  undefined1 local_b8 [32];
  Own<kj::_::PromiseNode> local_98;
  Own<kj::_::PromiseNode> local_88;
  PointerReader local_78;
  StructReader local_58;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_78);
  local_b8._16_8_ = local_78.pointer;
  local_b8._24_8_ = local_78._24_8_;
  PointerReader::getStruct(&local_58,(PointerReader *)local_b8,(word *)0x0);
  if (local_58.pointerCount == 0) {
    local_58.nestingLimit = 0x7fffffff;
    local_58.pointers = (WirePointer *)0x0;
    local_58.segment = (SegmentReader *)0x0;
    local_58.capTable = (CapTableReader *)0x0;
  }
  local_b8._24_4_ = local_58.nestingLimit;
  local_b8._0_8_ = local_58.segment;
  local_b8._8_8_ = local_58.capTable;
  local_b8._16_8_ = local_58.pointers;
  PointerReader::getCapability(&local_78);
  puVar2 = (undefined8 *)CONCAT44(local_78.segment._4_4_,local_78.segment._0_4_);
  plVar3 = (long *)CONCAT44(local_78.capTable._4_4_,local_78.capTable._0_4_);
  PVar6 = ClientHook::whenResolved((ClientHook *)&local_98);
  (**(code **)(*plVar3 + 0x20))(local_b8 + 8,plVar3,PVar6.super_PromiseBase.node.ptr);
  local_b8._0_8_ = &Capability::Client::typeinfo;
  local_b8._24_8_ = in_RDX;
  this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_98,
             kj::_::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1043:34),_kj::_::PropagateException>
             ::anon_class_32_2_dc087ca5_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00635d60;
  pwVar1 = (((SegmentReader *)(local_b8._0_8_ + -0x28))->ptr).ptr;
  this_00[1].dependency.disposer = *(Disposer **)(local_b8 + (long)pwVar1);
  this_00[1].dependency.ptr = *(PromiseNode **)((long)&pwVar1[1].content + (long)local_b8);
  *(undefined8 *)((long)&pwVar1[1].content + (long)local_b8) = 0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&Capability::Client::typeinfo;
  this_00[1].continuationTracePtr = (void *)local_b8._24_8_;
  local_88.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  local_88.ptr = (PromiseNode *)this_00;
  OVar7 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_78,&local_88);
  pPVar5 = local_88.ptr;
  *(undefined4 *)&this->super_Server = local_78.segment._0_4_;
  *(undefined4 *)&(this->super_Server).field_0x4 = local_78.segment._4_4_;
  *(undefined4 *)&(this->super_Server).field_0x8 = local_78.capTable._0_4_;
  *(undefined4 *)&(this->super_Server).field_0xc = local_78.capTable._4_4_;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode,OVar7.ptr);
  }
  uVar4 = local_b8._16_8_;
  if ((WirePointer *)local_b8._16_8_ != (WirePointer *)0x0) {
    local_b8._16_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_b8._8_8_)
              (local_b8._8_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar4)->value +
               *(long *)((long)*(WirePointer *)uVar4 + -0x10));
  }
  pPVar5 = local_98.ptr;
  if (local_98.ptr != (PromiseNode *)0x0) {
    local_98.ptr = (PromiseNode *)0x0;
    (**(local_98.disposer)->_vptr_Disposer)
              (local_98.disposer,pPVar5->_vptr_PromiseNode[-2] + (long)&pPVar5->_vptr_PromiseNode);
  }
  (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  PVar6.super_PromiseBase.node.ptr = extraout_RDX;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }